

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  U32 *pUVar8;
  long lVar9;
  uint uVar10;
  ulong *puVar11;
  uint uVar12;
  ulong *puVar13;
  seqDef *psVar14;
  ulong *puVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  BYTE *pStart_3;
  BYTE *pBVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong *puVar28;
  long lVar29;
  BYTE *pBVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  ulong *puVar34;
  U32 UVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  ulong *puVar39;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  ulong *local_c0;
  long local_a0;
  
  puVar4 = (ulong *)((long)src + srcSize);
  puVar28 = (ulong *)((long)src + (srcSize - 8));
  pBVar19 = (ms->window).base + (ms->window).dictLimit;
  uVar5 = rep[1];
  puVar39 = (ulong *)((ulong)(pBVar19 == (BYTE *)src) + (long)src);
  uVar31 = (int)puVar39 - (int)pBVar19;
  uVar37 = (ulong)uVar5;
  if (uVar31 < uVar5) {
    uVar37 = 0;
  }
  uVar36 = (uint)uVar37;
  uVar6 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  uVar21 = (ulong)uVar6;
  if (uVar31 < uVar6) {
    uVar21 = 0;
  }
  uVar20 = (uint)uVar21;
  if (puVar28 <= puVar39) {
LAB_00194f4e:
    uVar12 = 0;
    if (uVar31 < uVar5) {
      uVar12 = uVar5;
    }
    if (uVar31 < uVar6) {
      uVar12 = uVar6;
    }
    if (uVar20 == 0) {
      uVar20 = uVar12;
    }
    if (uVar36 != 0) {
      uVar12 = uVar36;
    }
    *rep = uVar20;
    rep[1] = uVar12;
    return (long)puVar4 - (long)src;
  }
  puVar1 = (ulong *)((long)puVar4 - 7);
  puVar2 = (ulong *)((long)puVar4 - 3);
  puVar3 = (ulong *)((long)puVar4 - 1);
LAB_00193eee:
  uVar36 = (uint)uVar37;
  uVar20 = (uint)uVar21;
  lVar29 = -uVar21;
  if (uVar20 == 0) {
    uVar25 = 0;
  }
  else {
    uVar25 = 0;
    if (*(int *)((long)puVar39 + 1) == *(int *)((long)((long)puVar39 + 1U) - uVar21)) {
      puVar15 = (ulong *)((long)puVar39 + 5);
      puVar13 = (ulong *)((long)puVar39 + lVar29 + 5);
      puVar34 = puVar15;
      if (puVar15 < puVar1) {
        if (*puVar13 == *puVar15) {
          lVar17 = 0;
          do {
            puVar34 = (ulong *)((long)puVar39 + lVar17 + 0xd);
            if (puVar1 <= puVar34) {
              puVar13 = (ulong *)((long)puVar39 + lVar29 + lVar17 + 0xd);
              puVar34 = (ulong *)((long)puVar39 + lVar17 + 0xd);
              goto LAB_00193fa3;
            }
            uVar25 = *(ulong *)((long)puVar39 + lVar17 + lVar29 + 0xd);
            uVar27 = *puVar34;
            lVar17 = lVar17 + 8;
          } while (uVar25 == uVar27);
          uVar27 = uVar27 ^ uVar25;
          uVar25 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar25 = (uVar25 >> 3 & 0x1fffffff) + lVar17;
        }
        else {
          uVar27 = *puVar15 ^ *puVar13;
          uVar25 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
            }
          }
          uVar25 = uVar25 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00193fa3:
        if ((puVar34 < puVar2) && ((int)*puVar13 == (int)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 4);
          puVar13 = (ulong *)((long)puVar13 + 4);
        }
        if ((puVar34 < puVar3) && ((short)*puVar13 == (short)*puVar34)) {
          puVar34 = (ulong *)((long)puVar34 + 2);
          puVar13 = (ulong *)((long)puVar13 + 2);
        }
        if (puVar34 < puVar4) {
          puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar13 == (char)*puVar34));
        }
        uVar25 = (long)puVar34 - (long)puVar15;
      }
      uVar25 = uVar25 + 4;
    }
  }
  UVar35 = (U32)puVar39;
  if (cParams->searchLength - 6 < 2) {
    pUVar8 = ms->chainTable;
    uVar38 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar12 = (ms->window).lowLimit;
    uVar33 = UVar35 - (int)pBVar30;
    uVar22 = uVar33 - uVar38;
    if (uVar33 < uVar38) {
      uVar22 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar35);
    if (uVar12 < uVar10) {
      iVar16 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 99999999;
      uVar18 = 3;
      do {
        puVar15 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar18 + (long)puVar15) == *(char *)((long)puVar39 + uVar18)) {
          puVar34 = puVar39;
          if (puVar39 < puVar1) {
            if (*puVar15 == *puVar39) {
              lVar17 = (ulong)uVar10 + 8;
              lVar32 = 0;
              do {
                puVar34 = (ulong *)((long)puVar39 + lVar32 + 8);
                if (puVar1 <= puVar34) {
                  puVar15 = (ulong *)(pBVar30 + lVar32 + lVar17);
                  goto LAB_0019411f;
                }
                lVar9 = lVar32 + lVar17;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar34);
              uVar23 = *puVar34 ^ *(ulong *)(pBVar30 + lVar9);
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = (uVar24 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar23 = *puVar39 ^ *puVar15;
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = uVar24 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0019411f:
            if ((puVar34 < puVar2) && ((int)*puVar15 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar34 < puVar3) && ((short)*puVar15 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar34 < puVar4) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar15 == (char)*puVar34));
            }
            uVar24 = (long)puVar34 - (long)puVar39;
          }
          if ((uVar18 < uVar24) &&
             (uVar27 = (ulong)((uVar33 + 2) - uVar10), uVar18 = uVar24,
             (ulong *)((long)puVar39 + uVar24) == puVar4)) goto LAB_00194530;
        }
        uVar24 = uVar18;
        if ((uVar10 <= uVar22) ||
           ((uVar10 = pUVar8[uVar10 & uVar38 - 1], uVar10 <= uVar12 ||
            (iVar16 = iVar16 + -1, uVar18 = uVar24, iVar16 == 0)))) goto LAB_00194530;
      } while( true );
    }
  }
  else if (cParams->searchLength == 5) {
    pUVar8 = ms->chainTable;
    uVar38 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar12 = (ms->window).lowLimit;
    uVar33 = UVar35 - (int)pBVar30;
    uVar22 = uVar33 - uVar38;
    if (uVar33 < uVar38) {
      uVar22 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar35);
    if (uVar12 < uVar10) {
      iVar16 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 99999999;
      uVar18 = 3;
      do {
        puVar15 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar18 + (long)puVar15) == *(char *)((long)puVar39 + uVar18)) {
          puVar34 = puVar39;
          if (puVar39 < puVar1) {
            if (*puVar15 == *puVar39) {
              lVar17 = (ulong)uVar10 + 8;
              lVar32 = 0;
              do {
                puVar34 = (ulong *)((long)puVar39 + lVar32 + 8);
                if (puVar1 <= puVar34) {
                  puVar15 = (ulong *)(pBVar30 + lVar32 + lVar17);
                  goto LAB_001942da;
                }
                lVar9 = lVar32 + lVar17;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar34);
              uVar23 = *puVar34 ^ *(ulong *)(pBVar30 + lVar9);
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = (uVar24 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar23 = *puVar39 ^ *puVar15;
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = uVar24 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001942da:
            if ((puVar34 < puVar2) && ((int)*puVar15 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar34 < puVar3) && ((short)*puVar15 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar34 < puVar4) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar15 == (char)*puVar34));
            }
            uVar24 = (long)puVar34 - (long)puVar39;
          }
          if ((uVar18 < uVar24) &&
             (uVar27 = (ulong)((uVar33 + 2) - uVar10), uVar18 = uVar24,
             (ulong *)((long)puVar39 + uVar24) == puVar4)) goto LAB_00194530;
        }
        uVar24 = uVar18;
        if ((uVar10 <= uVar22) ||
           ((uVar10 = pUVar8[uVar10 & uVar38 - 1], uVar10 <= uVar12 ||
            (iVar16 = iVar16 + -1, uVar18 = uVar24, iVar16 == 0)))) goto LAB_00194530;
      } while( true );
    }
  }
  else {
    pUVar8 = ms->chainTable;
    uVar38 = 1 << ((byte)cParams->chainLog & 0x1f);
    pBVar30 = (ms->window).base;
    uVar12 = (ms->window).lowLimit;
    uVar33 = UVar35 - (int)pBVar30;
    uVar22 = uVar33 - uVar38;
    if (uVar33 < uVar38) {
      uVar22 = 0;
    }
    uVar7 = cParams->searchLog;
    uVar10 = ZSTD_insertAndFindFirstIndex_internal
                       (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                        (BYTE *)(ulong)cParams->hashLog,UVar35);
    if (uVar12 < uVar10) {
      iVar16 = 1 << ((byte)uVar7 & 0x1f);
      uVar27 = 99999999;
      uVar18 = 3;
      do {
        puVar15 = (ulong *)(pBVar30 + uVar10);
        if (*(char *)(uVar18 + (long)puVar15) == *(char *)((long)puVar39 + uVar18)) {
          puVar34 = puVar39;
          if (puVar39 < puVar1) {
            if (*puVar15 == *puVar39) {
              lVar17 = (ulong)uVar10 + 8;
              lVar32 = 0;
              do {
                puVar34 = (ulong *)((long)puVar39 + lVar32 + 8);
                if (puVar1 <= puVar34) {
                  puVar15 = (ulong *)(pBVar30 + lVar32 + lVar17);
                  goto LAB_0019448b;
                }
                lVar9 = lVar32 + lVar17;
                lVar32 = lVar32 + 8;
              } while (*(ulong *)(pBVar30 + lVar9) == *puVar34);
              uVar23 = *puVar34 ^ *(ulong *)(pBVar30 + lVar9);
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = (uVar24 >> 3 & 0x1fffffff) + lVar32;
            }
            else {
              uVar23 = *puVar39 ^ *puVar15;
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar24 = uVar24 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_0019448b:
            if ((puVar34 < puVar2) && ((int)*puVar15 == (int)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar15 = (ulong *)((long)puVar15 + 4);
            }
            if ((puVar34 < puVar3) && ((short)*puVar15 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar15 = (ulong *)((long)puVar15 + 2);
            }
            if (puVar34 < puVar4) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar15 == (char)*puVar34));
            }
            uVar24 = (long)puVar34 - (long)puVar39;
          }
          if ((uVar18 < uVar24) &&
             (uVar27 = (ulong)((uVar33 + 2) - uVar10), uVar18 = uVar24,
             (ulong *)((long)puVar39 + uVar24) == puVar4)) goto LAB_00194530;
        }
        uVar24 = uVar18;
        if ((uVar10 <= uVar22) ||
           ((uVar10 = pUVar8[uVar10 & uVar38 - 1], uVar10 <= uVar12 ||
            (iVar16 = iVar16 + -1, uVar18 = uVar24, iVar16 == 0)))) goto LAB_00194530;
      } while( true );
    }
  }
  uVar24 = 3;
  uVar27 = 99999999;
LAB_00194530:
  uVar18 = uVar25;
  if (uVar25 < uVar24) {
    uVar18 = uVar24;
  }
  if (3 < uVar18) {
    puVar15 = puVar39;
    if (uVar24 <= uVar25) {
      uVar27 = 0;
      puVar15 = (ulong *)((long)puVar39 + 1U);
    }
    puVar34 = (ulong *)((long)puVar39 + 0xd);
    local_a0 = (long)puVar39 + 9;
LAB_001945a0:
    uVar25 = uVar18;
    uVar37 = uVar27;
    local_c0 = puVar15;
    if (puVar39 < puVar28) {
      puVar15 = (ulong *)((long)puVar39 + 1);
      if (uVar27 == 0) {
        uVar37 = 0;
      }
      else if ((uVar20 != 0) && (*(int *)puVar15 == *(int *)((long)puVar15 + lVar29))) {
        puVar13 = (ulong *)((long)puVar39 + 5);
        puVar26 = (ulong *)((long)puVar39 + lVar29 + 5);
        puVar11 = puVar13;
        if (puVar13 < puVar1) {
          puVar11 = puVar34;
          if (*puVar26 == *puVar13) {
            do {
              if (puVar1 <= puVar11) {
                puVar26 = (ulong *)((long)puVar11 + lVar29);
                goto LAB_00194be4;
              }
              puVar26 = (ulong *)((long)puVar11 + lVar29);
              uVar21 = *puVar11;
              puVar11 = puVar11 + 1;
            } while (*puVar26 == uVar21);
            uVar21 = uVar21 ^ *puVar26;
            uVar18 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            puVar11 = (ulong *)((long)puVar11 + ((uVar18 >> 3 & 0x1fffffff) - 8));
            goto LAB_00194c29;
          }
          uVar18 = *puVar13 ^ *puVar26;
          uVar21 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
            }
          }
          uVar21 = uVar21 >> 3 & 0x1fffffff;
          uVar22 = (int)uVar27 + 1;
          uVar12 = 0x1f;
          if (uVar22 != 0) {
            for (; uVar22 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
        }
        else {
LAB_00194be4:
          if ((puVar11 < puVar2) && ((int)*puVar26 == (int)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 4);
            puVar26 = (ulong *)((long)puVar26 + 4);
          }
          if ((puVar11 < puVar3) && ((short)*puVar26 == (short)*puVar11)) {
            puVar11 = (ulong *)((long)puVar11 + 2);
            puVar26 = (ulong *)((long)puVar26 + 2);
          }
          if (puVar11 < puVar4) {
            puVar11 = (ulong *)((long)puVar11 + (ulong)((char)*puVar26 == (char)*puVar11));
          }
LAB_00194c29:
          uVar21 = (long)puVar11 - (long)puVar13;
          if (0xfffffffffffffffb < uVar21) goto LAB_00194640;
          uVar22 = (int)uVar27 + 1;
          uVar12 = 0x1f;
          if (uVar22 != 0) {
            for (; uVar22 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
        }
        if ((int)((uVar12 ^ 0x1f) + (int)uVar25 * 3 + -0x1e) < (int)(uVar21 + 4) * 3) {
          uVar25 = uVar21 + 4;
          uVar37 = 0;
          local_c0 = puVar15;
        }
      }
LAB_00194640:
      UVar35 = (U32)puVar15;
      if (cParams->searchLength - 6 < 2) {
        pUVar8 = ms->chainTable;
        uVar33 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar12 = (ms->window).lowLimit;
        uVar38 = UVar35 - (int)pBVar30;
        uVar22 = uVar38 - uVar33;
        if (uVar38 < uVar33) {
          uVar22 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar12 < uVar10) {
          iVar16 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 99999999;
          uVar21 = 3;
          do {
            puVar39 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar21 + (long)puVar39) == *(char *)((long)puVar15 + uVar21)) {
              puVar13 = puVar15;
              if (puVar15 < puVar1) {
                if (*puVar39 == *puVar15) {
                  lVar17 = (ulong)uVar10 + 8;
                  lVar32 = 0;
                  do {
                    puVar13 = (ulong *)(local_a0 + lVar32);
                    if (puVar1 <= puVar13) {
                      puVar39 = (ulong *)(pBVar30 + lVar32 + lVar17);
                      goto LAB_00194767;
                    }
                    lVar9 = lVar32 + lVar17;
                    lVar32 = lVar32 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == *puVar13);
                  uVar24 = *puVar13 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar18 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar32;
                }
                else {
                  uVar24 = *puVar15 ^ *puVar39;
                  uVar18 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00194767:
                if ((puVar13 < puVar2) && ((int)*puVar39 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar39 = (ulong *)((long)puVar39 + 4);
                }
                if ((puVar13 < puVar3) && ((short)*puVar39 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar39 = (ulong *)((long)puVar39 + 2);
                }
                if (puVar13 < puVar4) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar39 == (char)*puVar13));
                }
                uVar18 = (long)puVar13 - (long)puVar15;
              }
              if ((uVar21 < uVar18) &&
                 (uVar27 = (ulong)((uVar38 + 2) - uVar10), uVar21 = uVar18,
                 (ulong *)((long)puVar15 + uVar18) == puVar4)) goto LAB_00194b6d;
            }
            uVar18 = uVar21;
            if ((uVar10 <= uVar22) ||
               ((uVar10 = pUVar8[uVar10 & uVar33 - 1], uVar10 <= uVar12 ||
                (iVar16 = iVar16 + -1, uVar21 = uVar18, iVar16 == 0)))) goto LAB_00194b6d;
          } while( true );
        }
      }
      else if (cParams->searchLength == 5) {
        pUVar8 = ms->chainTable;
        uVar38 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar12 = (ms->window).lowLimit;
        uVar33 = UVar35 - (int)pBVar30;
        uVar22 = uVar33 - uVar38;
        if (uVar33 < uVar38) {
          uVar22 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar12 < uVar10) {
          iVar16 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 99999999;
          uVar21 = 3;
          do {
            puVar13 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar21 + (long)puVar13) == *(char *)((long)puVar15 + uVar21)) {
              puVar26 = puVar15;
              if (puVar15 < puVar1) {
                if (*puVar13 == *puVar15) {
                  lVar17 = (ulong)uVar10 + 8;
                  lVar32 = 0;
                  do {
                    if (puVar1 <= (ulong *)(local_a0 + lVar32)) {
                      puVar13 = (ulong *)(pBVar30 + lVar32 + lVar17);
                      puVar26 = (ulong *)(local_a0 + lVar32);
                      goto LAB_0019493d;
                    }
                    lVar9 = lVar32 + lVar17;
                    uVar18 = *(ulong *)((long)puVar39 + lVar32 + 9);
                    lVar32 = lVar32 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == uVar18);
                  uVar18 = uVar18 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar24 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  uVar18 = (uVar24 >> 3 & 0x1fffffff) + lVar32;
                }
                else {
                  uVar24 = *puVar15 ^ *puVar13;
                  uVar18 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0019493d:
                if ((puVar26 < puVar2) && ((int)*puVar13 == (int)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 4);
                  puVar13 = (ulong *)((long)puVar13 + 4);
                }
                if ((puVar26 < puVar3) && ((short)*puVar13 == (short)*puVar26)) {
                  puVar26 = (ulong *)((long)puVar26 + 2);
                  puVar13 = (ulong *)((long)puVar13 + 2);
                }
                if (puVar26 < puVar4) {
                  puVar26 = (ulong *)((long)puVar26 + (ulong)((char)*puVar13 == (char)*puVar26));
                }
                uVar18 = (long)puVar26 - (long)puVar15;
              }
              if ((uVar21 < uVar18) &&
                 (uVar27 = (ulong)((uVar33 + 2) - uVar10), uVar21 = uVar18,
                 (ulong *)((long)puVar15 + uVar18) == puVar4)) goto LAB_00194b6d;
            }
            uVar18 = uVar21;
            if ((uVar10 <= uVar22) ||
               ((uVar10 = pUVar8[uVar10 & uVar38 - 1], uVar10 <= uVar12 ||
                (iVar16 = iVar16 + -1, uVar21 = uVar18, iVar16 == 0)))) goto LAB_00194b6d;
          } while( true );
        }
      }
      else {
        pUVar8 = ms->chainTable;
        uVar38 = 1 << ((byte)cParams->chainLog & 0x1f);
        pBVar30 = (ms->window).base;
        uVar12 = (ms->window).lowLimit;
        uVar33 = UVar35 - (int)pBVar30;
        uVar22 = uVar33 - uVar38;
        if (uVar33 < uVar38) {
          uVar22 = 0;
        }
        uVar7 = cParams->searchLog;
        uVar10 = ZSTD_insertAndFindFirstIndex_internal
                           (ms,(ZSTD_compressionParameters *)(ulong)cParams->chainLog,
                            (BYTE *)(ulong)cParams->hashLog,UVar35);
        if (uVar12 < uVar10) {
          iVar16 = 1 << ((byte)uVar7 & 0x1f);
          uVar27 = 99999999;
          uVar21 = 3;
          do {
            puVar39 = (ulong *)(pBVar30 + uVar10);
            if (*(char *)(uVar21 + (long)puVar39) == *(char *)((long)puVar15 + uVar21)) {
              puVar13 = puVar15;
              if (puVar15 < puVar1) {
                if (*puVar39 == *puVar15) {
                  lVar17 = (ulong)uVar10 + 8;
                  lVar32 = 0;
                  do {
                    puVar13 = (ulong *)(local_a0 + lVar32);
                    if (puVar1 <= puVar13) {
                      puVar39 = (ulong *)(pBVar30 + lVar32 + lVar17);
                      goto LAB_00194aec;
                    }
                    lVar9 = lVar32 + lVar17;
                    lVar32 = lVar32 + 8;
                  } while (*(ulong *)(pBVar30 + lVar9) == *puVar13);
                  uVar24 = *puVar13 ^ *(ulong *)(pBVar30 + lVar9);
                  uVar18 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = (uVar18 >> 3 & 0x1fffffff) + lVar32;
                }
                else {
                  uVar24 = *puVar15 ^ *puVar39;
                  uVar18 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00194aec:
                if ((puVar13 < puVar2) && ((int)*puVar39 == (int)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 4);
                  puVar39 = (ulong *)((long)puVar39 + 4);
                }
                if ((puVar13 < puVar3) && ((short)*puVar39 == (short)*puVar13)) {
                  puVar13 = (ulong *)((long)puVar13 + 2);
                  puVar39 = (ulong *)((long)puVar39 + 2);
                }
                if (puVar13 < puVar4) {
                  puVar13 = (ulong *)((long)puVar13 + (ulong)((char)*puVar39 == (char)*puVar13));
                }
                uVar18 = (long)puVar13 - (long)puVar15;
              }
              if ((uVar21 < uVar18) &&
                 (uVar27 = (ulong)((uVar33 + 2) - uVar10), uVar21 = uVar18,
                 (ulong *)((long)puVar15 + uVar18) == puVar4)) goto LAB_00194b6d;
            }
            uVar18 = uVar21;
            if ((uVar10 <= uVar22) ||
               ((uVar10 = pUVar8[uVar10 & uVar38 - 1], uVar10 <= uVar12 ||
                (iVar16 = iVar16 + -1, uVar21 = uVar18, iVar16 == 0)))) goto LAB_00194b6d;
          } while( true );
        }
      }
    }
    goto LAB_00194c98;
  }
  puVar39 = (ulong *)((long)puVar39 + ((long)puVar39 - (long)src >> 8) + 1);
  goto LAB_00194f3d;
LAB_00194b6d:
  if (uVar18 < 4) goto LAB_00194c98;
  uVar22 = (int)uVar37 + 1;
  uVar12 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> uVar12 == 0; uVar12 = uVar12 - 1) {
    }
  }
  uVar22 = (int)uVar27 + 1;
  iVar16 = 0x1f;
  if (uVar22 != 0) {
    for (; uVar22 >> iVar16 == 0; iVar16 = iVar16 + -1) {
    }
  }
  puVar34 = (ulong *)((long)puVar34 + 1);
  local_a0 = local_a0 + 1;
  puVar39 = puVar15;
  if ((int)uVar18 * 4 - iVar16 <= (int)((uVar12 ^ 0x1f) + (int)uVar25 * 4 + -0x1b))
  goto LAB_00194c98;
  goto LAB_001945a0;
LAB_00194c98:
  if (uVar37 == 0) {
    UVar35 = 1;
    uVar12 = uVar20;
  }
  else {
    if ((src < local_c0) && (pBVar19 < (BYTE *)((long)local_c0 + (2 - uVar37)))) {
      puVar39 = local_c0;
      while (local_c0 = puVar39,
            *(char *)((long)puVar39 - 1) == *(char *)((long)puVar39 + (1 - uVar37))) {
        local_c0 = (ulong *)((long)puVar39 - 1);
        uVar25 = uVar25 + 1;
        if ((local_c0 <= src) ||
           (pBVar30 = (BYTE *)((long)puVar39 + (1 - uVar37)), puVar39 = local_c0, pBVar30 <= pBVar19
           )) break;
      }
    }
    UVar35 = (int)uVar37 + 1;
    uVar12 = (int)uVar37 - 2;
    uVar36 = uVar20;
  }
  uVar37 = (ulong)uVar36;
  uVar21 = (ulong)uVar12;
  uVar27 = (long)local_c0 - (long)src;
  puVar15 = (ulong *)seqStore->lit;
  puVar39 = (ulong *)((long)puVar15 + uVar27);
  do {
    *puVar15 = *src;
    puVar15 = puVar15 + 1;
    src = (void *)((long)src + 8);
  } while (puVar15 < puVar39);
  seqStore->lit = seqStore->lit + uVar27;
  if (uVar27 < 0x10000) {
    psVar14 = seqStore->sequences;
  }
  else {
    seqStore->longLengthID = 1;
    psVar14 = seqStore->sequences;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar14->litLength = (U16)uVar27;
  psVar14->offset = UVar35;
  if (0xffff < uVar25 - 3) {
    seqStore->longLengthID = 2;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
  }
  psVar14->matchLength = (U16)(uVar25 - 3);
  seqStore->sequences = psVar14 + 1;
  src = (void *)((long)local_c0 + uVar25);
  puVar39 = (ulong *)src;
  if ((uVar36 != 0) && (src <= puVar28)) {
    while (uVar27 = uVar21, uVar25 = uVar37, uVar21 = uVar27, puVar39 = (ulong *)src,
          uVar37 = uVar25, (int)*src == *(int *)((long)src - uVar25)) {
      lVar29 = -uVar25;
      puVar39 = (ulong *)((long)src + 4);
      puVar34 = (ulong *)((long)src + lVar29 + 4);
      puVar15 = puVar39;
      if (puVar39 < puVar1) {
        if (*puVar34 == *puVar39) {
          lVar17 = 0;
          do {
            puVar15 = (ulong *)((long)src + lVar17 + 0xc);
            if (puVar1 <= puVar15) {
              puVar34 = (ulong *)((long)src + lVar29 + lVar17 + 0xc);
              puVar15 = (ulong *)((long)src + lVar17 + 0xc);
              goto LAB_00194e7b;
            }
            uVar37 = *(ulong *)((long)src + lVar17 + lVar29 + 0xc);
            uVar21 = *puVar15;
            lVar17 = lVar17 + 8;
          } while (uVar37 == uVar21);
          uVar21 = uVar21 ^ uVar37;
          uVar37 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          uVar37 = (uVar37 >> 3 & 0x1fffffff) + lVar17;
        }
        else {
          uVar21 = *puVar39 ^ *puVar34;
          uVar37 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar37 & 1) == 0; uVar37 = uVar37 + 1) {
            }
          }
          uVar37 = uVar37 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_00194e7b:
        if ((puVar15 < puVar2) && ((int)*puVar34 == (int)*puVar15)) {
          puVar15 = (ulong *)((long)puVar15 + 4);
          puVar34 = (ulong *)((long)puVar34 + 4);
        }
        if ((puVar15 < puVar3) && ((short)*puVar34 == (short)*puVar15)) {
          puVar15 = (ulong *)((long)puVar15 + 2);
          puVar34 = (ulong *)((long)puVar34 + 2);
        }
        if (puVar15 < puVar4) {
          puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar34 == (char)*puVar15));
        }
        uVar37 = (long)puVar15 - (long)puVar39;
      }
      *(ulong *)seqStore->lit = *src;
      psVar14 = seqStore->sequences;
      psVar14->litLength = 0;
      psVar14->offset = 1;
      if (0xffff < uVar37 + 1) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar14 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar14->matchLength = (U16)(uVar37 + 1);
      seqStore->sequences = psVar14 + 1;
      src = (void *)((long)src + uVar37 + 4);
      uVar21 = uVar25;
      puVar39 = (ulong *)src;
      uVar37 = uVar27;
      if (((int)uVar27 == 0) || (puVar28 < src)) break;
    }
  }
LAB_00194f3d:
  uVar36 = (uint)uVar37;
  uVar20 = (uint)uVar21;
  if (puVar28 <= puVar39) goto LAB_00194f4e;
  goto LAB_00193eee;
}

Assistant:

size_t ZSTD_compressBlock_lazy(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 1);
}